

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xvnmsubsp(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  sbyte sVar2;
  sbyte sVar3;
  uintptr_t o_3;
  TCGv_ptr pTVar4;
  TCGv_ptr pTVar5;
  TCGv_ptr pTVar6;
  TCGv_ptr pTVar7;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_2;
  bool bVar8;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  if (ctx->vsx_enabled == false) {
    gen_exception(ctx,0x5e);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar4 = gen_vsr_ptr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | (ctx->opcode & 1) << 5);
  pTVar5 = gen_vsr_ptr(tcg_ctx,(ctx->opcode >> 0x10 & 0x1f) + (ctx->opcode & 4) * 8);
  uVar1 = ctx->opcode;
  bVar8 = (uVar1 & 0x40) == 0;
  sVar2 = 0xb;
  sVar3 = 0x15;
  if (bVar8) {
    sVar2 = 0x15;
    sVar3 = 0xb;
  }
  pTVar6 = gen_vsr_ptr(tcg_ctx,uVar1 >> sVar3 & 0x1f | uVar1 << (bVar8 ^ 5U) & 0x20);
  pTVar7 = gen_vsr_ptr(tcg_ctx,ctx->opcode >> sVar2 & 0x1f | ctx->opcode << (bVar8 | 4U) & 0x20);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_50 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
  local_48 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
  local_40 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
  local_38 = (TCGTemp *)(pTVar7 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,helper_xvnmsubsp,(TCGTemp *)0x0,5,&local_58);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar7 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_xxbrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;
    TCGv_i64 xbl;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    xbl = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, xB(ctx->opcode));
    get_cpu_vsrl(tcg_ctx, xbl, xB(ctx->opcode));

    tcg_gen_bswap64_i64(tcg_ctx, xth, xbh);
    tcg_gen_bswap64_i64(tcg_ctx, xtl, xbl);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    set_cpu_vsrl(tcg_ctx, xT(ctx->opcode), xtl);

    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xbl);
}